

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::OneofDescriptorProto::operator==
          (OneofDescriptorProto *this,OneofDescriptorProto *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  if (_Var1) {
    _Var1 = ::std::operator==(&this->name_,&other->name_);
    if (_Var1) {
      bVar2 = protozero::operator==(&this->options_,&other->options_);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool OneofDescriptorProto::operator==(const OneofDescriptorProto& other) const {
  return unknown_fields_ == other.unknown_fields_
   && name_ == other.name_
   && options_ == other.options_;
}